

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

void __thiscall
google::
sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::sparse_hashtable(sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *this,size_type expected_max_items_in_table,Hasher *hf,Hasher *eql,SelectKey *ext
                  ,SetKey *set,Alloc<int,_unsigned_long,_18446744073709551615UL> *alloc)

{
  int iVar1;
  size_type sz;
  Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL> local_28;
  
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_compares_ = hf->num_compares_;
  iVar1 = hf->num_hashes_;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.id_ =
       hf->id_;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_hashes_ = iVar1;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.consider_shrink_ =
       false;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_empty_ = false;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_deleted_ = false;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.num_ht_copies_ = 0;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_threshold_ = 0
  ;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_threshold_ = 0;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_factor_ = 0.8;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_factor_ = 0.32;
  iVar1 = eql->num_hashes_;
  (this->key_info).super_Hasher.id_ = eql->id_;
  (this->key_info).super_Hasher.num_hashes_ = iVar1;
  (this->key_info).super_Hasher.num_compares_ = eql->num_compares_;
  this->num_deleted = 0;
  if (expected_max_items_in_table == 0) {
    sz = 0x20;
  }
  else {
    sz = sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::min_buckets
                   ((sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *)this,
                    expected_max_items_in_table,0);
  }
  local_28.id_ = alloc->id_;
  local_28.count_ = alloc->count_;
  sparsetable<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
  ::sparsetable(&this->table,sz,&local_28);
  sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::reset_thresholds
            ((sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *)this,
             (this->table).settings.table_size);
  return;
}

Assistant:

explicit sparse_hashtable(size_type expected_max_items_in_table = 0,
                            const HashFcn& hf = HashFcn(),
                            const EqualKey& eql = EqualKey(),
                            const ExtractKey& ext = ExtractKey(),
                            const SetKey& set = SetKey(),
                            const Alloc& alloc = Alloc())
      : settings(hf),
        key_info(ext, set, eql),
        num_deleted(0),
        table((expected_max_items_in_table == 0
                   ? HT_DEFAULT_STARTING_BUCKETS
                   : settings.min_buckets(expected_max_items_in_table, 0)),
              alloc) {
    settings.reset_thresholds(bucket_count());
  }